

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

void mbedtls_ecp_group_free(mbedtls_ecp_group *grp)

{
  long lVar1;
  ulong uVar2;
  
  if (grp != (mbedtls_ecp_group *)0x0) {
    if (grp->h != 1) {
      mbedtls_mpi_free(&grp->A);
      mbedtls_mpi_free(&grp->B);
      mbedtls_ecp_point_free(&grp->G);
      mbedtls_mpi_free(&grp->N);
      mbedtls_mpi_free(&grp->P);
    }
    if (grp->T != (mbedtls_ecp_point *)0x0) {
      lVar1 = 0;
      for (uVar2 = 0; uVar2 < grp->T_size; uVar2 = uVar2 + 1) {
        mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(grp->T->X).p + lVar1));
        lVar1 = lVar1 + 0x30;
      }
      free(grp->T);
    }
    mbedtls_platform_zeroize(grp,0xc0);
    return;
  }
  return;
}

Assistant:

void mbedtls_ecp_group_free(mbedtls_ecp_group *grp)
{
    size_t i;

    if (grp == NULL) {
        return;
    }

    if (grp->h != 1) {
        mbedtls_mpi_free(&grp->A);
        mbedtls_mpi_free(&grp->B);
        mbedtls_ecp_point_free(&grp->G);

#if !defined(MBEDTLS_ECP_WITH_MPI_UINT)
        mbedtls_mpi_free(&grp->N);
        mbedtls_mpi_free(&grp->P);
#endif
    }

    if (!ecp_group_is_static_comb_table(grp) && grp->T != NULL) {
        for (i = 0; i < grp->T_size; i++) {
            mbedtls_ecp_point_free(&grp->T[i]);
        }
        mbedtls_free(grp->T);
    }

    mbedtls_platform_zeroize(grp, sizeof(mbedtls_ecp_group));
}